

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O2

void irr::video::CColorConverter::convert_A1R5G5B5toB8G8R8(void *sP,s32 sN,void *dP)

{
  ulong uVar1;
  ulong uVar2;
  u16 *sB;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)sN;
  if (sN < 1) {
    uVar2 = uVar1;
  }
  for (; (int)uVar2 != (int)uVar1; uVar1 = uVar1 + 1) {
    *(byte *)dP = (byte)(*(ushort *)((long)sP + uVar1 * 2) >> 7) & 0xf8;
    *(byte *)((long)dP + 1) = (byte)(*(ushort *)((long)sP + uVar1 * 2) >> 2) & 0xf8;
    *(char *)((long)dP + 2) = *(char *)((long)sP + uVar1 * 2) << 3;
    dP = (void *)((long)dP + 3);
  }
  return;
}

Assistant:

void CColorConverter::convert_A1R5G5B5toB8G8R8(const void *sP, s32 sN, void *dP)
{
	u16 *sB = (u16 *)sP;
	u8 *dB = (u8 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		dB[0] = (*sB & 0x7c00) >> 7;
		dB[1] = (*sB & 0x03e0) >> 2;
		dB[2] = (*sB & 0x1f) << 3;

		sB += 1;
		dB += 3;
	}
}